

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm1d.c
# Opt level: O2

void av1_iadst16(int32_t *input,int32_t *output,int8_t cos_bit,int8_t *stage_range)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int32_t iVar4;
  int32_t iVar5;
  int32_t iVar6;
  int32_t iVar7;
  int32_t iVar8;
  int32_t iVar9;
  int32_t iVar10;
  int32_t iVar11;
  int32_t iVar12;
  int32_t iVar13;
  int32_t iVar14;
  int32_t iVar15;
  int32_t iVar16;
  int32_t iVar17;
  int32_t iVar18;
  int32_t iVar19;
  int32_t iVar20;
  int iVar21;
  undefined7 in_register_00000011;
  long lVar22;
  long lVar23;
  long lVar24;
  int32_t step [16];
  
  lVar24 = (long)(int)CONCAT71(in_register_00000011,cos_bit) * 0x100;
  *output = input[0xf];
  output[1] = *input;
  output[2] = input[0xd];
  output[3] = input[2];
  output[4] = input[0xb];
  output[5] = input[4];
  output[6] = input[9];
  output[7] = input[6];
  output[8] = input[7];
  output[9] = input[8];
  output[10] = input[5];
  output[0xb] = input[10];
  output[0xc] = input[3];
  output[0xd] = input[0xc];
  output[0xe] = input[1];
  output[0xf] = input[0xe];
  av1_range_check_buf(1,input,output,0x10,stage_range[1]);
  iVar1 = *(int *)((long)vert_filter_length_chroma + lVar24 + 600);
  iVar21 = *(int *)((long)vert_filter_length_chroma + lVar24 + 0x168);
  lVar23 = 1L << (cos_bit - 1U & 0x3f);
  step[0] = (int32_t)(*output * iVar21 + lVar23 + (long)(output[1] * iVar1) >> (cos_bit & 0x3fU));
  step[1] = (int32_t)(iVar1 * *output + lVar23 + (long)-(iVar21 * output[1]) >> (cos_bit & 0x3fU));
  iVar1 = *(int *)((long)vert_filter_length_chroma + lVar24 + 0x188);
  iVar21 = *(int *)((long)vert_filter_length_chroma + lVar24 + 0x238);
  step[2] = (int32_t)(output[2] * iVar1 + lVar23 + (long)(output[3] * iVar21) >> (cos_bit & 0x3fU));
  step[3] = (int32_t)(iVar21 * output[2] + lVar23 + (long)-(iVar1 * output[3]) >> (cos_bit & 0x3fU))
  ;
  iVar1 = *(int *)((long)vert_filter_length_chroma + lVar24 + 0x1a8);
  iVar21 = *(int *)((long)vert_filter_length_chroma + lVar24 + 0x218);
  step[4] = (int32_t)(output[4] * iVar1 + lVar23 + (long)(output[5] * iVar21) >> (cos_bit & 0x3fU));
  step[5] = (int32_t)(iVar21 * output[4] + lVar23 + (long)-(iVar1 * output[5]) >> (cos_bit & 0x3fU))
  ;
  iVar1 = *(int *)((long)vert_filter_length_chroma + lVar24 + 0x1c8);
  iVar21 = *(int *)((long)vert_filter_length_chroma + lVar24 + 0x1f8);
  step[6] = (int32_t)(output[6] * iVar1 + lVar23 + (long)(output[7] * iVar21) >> (cos_bit & 0x3fU));
  step[7] = (int32_t)(iVar21 * output[6] + lVar23 + (long)-(iVar1 * output[7]) >> (cos_bit & 0x3fU))
  ;
  iVar1 = *(int *)((long)vert_filter_length_chroma + lVar24 + 0x1e8);
  iVar21 = *(int *)((long)vert_filter_length_chroma + lVar24 + 0x1d8);
  step[8] = (int32_t)(output[8] * iVar1 + lVar23 + (long)(output[9] * iVar21) >> (cos_bit & 0x3fU));
  step[9] = (int32_t)(iVar21 * output[8] + lVar23 + (long)-(iVar1 * output[9]) >> (cos_bit & 0x3fU))
  ;
  iVar1 = *(int *)((long)vert_filter_length_chroma + lVar24 + 0x208);
  iVar21 = *(int *)((long)vert_filter_length_chroma + lVar24 + 0x1b8);
  step[10] = (int32_t)(output[10] * iVar1 + lVar23 + (long)(output[0xb] * iVar21) >>
                      (cos_bit & 0x3fU));
  step[0xb] = (int32_t)(iVar21 * output[10] + lVar23 + (long)-(iVar1 * output[0xb]) >>
                       (cos_bit & 0x3fU));
  iVar1 = *(int *)((long)vert_filter_length_chroma + lVar24 + 0x228);
  iVar21 = *(int *)((long)vert_filter_length_chroma + lVar24 + 0x198);
  iVar2 = *(int *)((long)vert_filter_length_chroma + lVar24 + 0x178);
  step[0xc] = (int32_t)(output[0xc] * iVar1 + lVar23 + (long)(output[0xd] * iVar21) >>
                       (cos_bit & 0x3fU));
  step[0xd] = (int32_t)(iVar21 * output[0xc] + lVar23 + (long)-(iVar1 * output[0xd]) >>
                       (cos_bit & 0x3fU));
  iVar1 = *(int *)((long)vert_filter_length_chroma + lVar24 + 0x248);
  step[0xe] = (int32_t)(output[0xe] * iVar1 + lVar23 + (long)(output[0xf] * iVar2) >>
                       (cos_bit & 0x3fU));
  step[0xf] = (int32_t)(iVar2 * output[0xe] + lVar23 + (long)-(iVar1 * output[0xf]) >>
                       (cos_bit & 0x3fU));
  av1_range_check_buf(2,input,step,0x10,stage_range[2]);
  iVar20 = step[8];
  iVar18 = step[0];
  iVar11 = clamp_value(step[8] + step[0],stage_range[3]);
  iVar4 = step[9];
  iVar19 = step[1];
  *output = iVar11;
  iVar12 = clamp_value(step[9] + step[1],stage_range[3]);
  iVar5 = step[10];
  iVar11 = step[2];
  output[1] = iVar12;
  iVar13 = clamp_value(step[10] + step[2],stage_range[3]);
  iVar6 = step[0xb];
  iVar12 = step[3];
  output[2] = iVar13;
  iVar14 = clamp_value(step[0xb] + step[3],stage_range[3]);
  iVar7 = step[0xc];
  iVar13 = step[4];
  output[3] = iVar14;
  iVar15 = clamp_value(step[0xc] + step[4],stage_range[3]);
  iVar8 = step[0xd];
  iVar14 = step[5];
  output[4] = iVar15;
  iVar16 = clamp_value(step[0xd] + step[5],stage_range[3]);
  iVar9 = step[0xe];
  iVar15 = step[6];
  output[5] = iVar16;
  iVar17 = clamp_value(step[0xe] + step[6],stage_range[3]);
  iVar10 = step[0xf];
  iVar16 = step[7];
  output[6] = iVar17;
  iVar17 = clamp_value(step[0xf] + step[7],stage_range[3]);
  output[7] = iVar17;
  iVar18 = clamp_value(iVar18 - iVar20,stage_range[3]);
  output[8] = iVar18;
  iVar18 = clamp_value(iVar19 - iVar4,stage_range[3]);
  output[9] = iVar18;
  iVar18 = clamp_value(iVar11 - iVar5,stage_range[3]);
  output[10] = iVar18;
  iVar18 = clamp_value(iVar12 - iVar6,stage_range[3]);
  output[0xb] = iVar18;
  iVar18 = clamp_value(iVar13 - iVar7,stage_range[3]);
  output[0xc] = iVar18;
  iVar18 = clamp_value(iVar14 - iVar8,stage_range[3]);
  output[0xd] = iVar18;
  iVar18 = clamp_value(iVar15 - iVar9,stage_range[3]);
  output[0xe] = iVar18;
  iVar18 = clamp_value(iVar16 - iVar10,stage_range[3]);
  output[0xf] = iVar18;
  av1_range_check_buf(3,input,output,0x10,stage_range[3]);
  step._0_8_ = *(undefined8 *)output;
  step._8_8_ = *(undefined8 *)(output + 2);
  step._16_8_ = *(undefined8 *)(output + 4);
  step._24_8_ = *(undefined8 *)(output + 6);
  iVar1 = *(int *)((long)vert_filter_length_chroma + lVar24 + 0x180);
  iVar21 = *(int *)((long)vert_filter_length_chroma + lVar24 + 0x240);
  step[8] = (int32_t)(output[8] * iVar1 + lVar23 + (long)(output[9] * iVar21) >> (cos_bit & 0x3fU));
  step[9] = (int32_t)(iVar21 * output[8] + lVar23 + (long)-(iVar1 * output[9]) >> (cos_bit & 0x3fU))
  ;
  iVar2 = *(int *)((long)vert_filter_length_chroma + lVar24 + 0x200);
  iVar3 = *(int *)((long)vert_filter_length_chroma + lVar24 + 0x1c0);
  step[10] = (int32_t)(output[10] * iVar2 + lVar23 + (long)(output[0xb] * iVar3) >>
                      (cos_bit & 0x3fU));
  step[0xb] = (int32_t)(iVar3 * output[10] + lVar23 + (long)-(iVar2 * output[0xb]) >>
                       (cos_bit & 0x3fU));
  step[0xc] = (int32_t)(output[0xd] * iVar1 + lVar23 + (long)-(iVar21 * output[0xc]) >>
                       (cos_bit & 0x3fU));
  step[0xd] = (int32_t)(output[0xc] * iVar1 + lVar23 + (long)(output[0xd] * iVar21) >>
                       (cos_bit & 0x3fU));
  step[0xe] = (int32_t)(output[0xf] * iVar2 + lVar23 + (long)-(iVar3 * output[0xe]) >>
                       (cos_bit & 0x3fU));
  step[0xf] = (int32_t)(output[0xe] * iVar2 + lVar23 + (long)(output[0xf] * iVar3) >>
                       (cos_bit & 0x3fU));
  av1_range_check_buf(4,input,step,0x10,stage_range[4]);
  iVar18 = step[0];
  iVar13 = step[4];
  iVar19 = clamp_value(step[4] + step[0],stage_range[5]);
  *output = iVar19;
  iVar19 = step[1];
  iVar14 = step[5];
  iVar11 = clamp_value(step[5] + step[1],stage_range[5]);
  output[1] = iVar11;
  iVar11 = step[2];
  iVar15 = step[6];
  iVar12 = clamp_value(step[6] + step[2],stage_range[5]);
  output[2] = iVar12;
  iVar12 = step[3];
  iVar16 = step[7];
  iVar20 = clamp_value(step[7] + step[3],stage_range[5]);
  output[3] = iVar20;
  iVar18 = clamp_value(iVar18 - iVar13,stage_range[5]);
  output[4] = iVar18;
  iVar18 = clamp_value(iVar19 - iVar14,stage_range[5]);
  output[5] = iVar18;
  iVar18 = clamp_value(iVar11 - iVar15,stage_range[5]);
  output[6] = iVar18;
  iVar19 = clamp_value(iVar12 - iVar16,stage_range[5]);
  iVar13 = step[0xc];
  iVar18 = step[8];
  output[7] = iVar19;
  iVar11 = clamp_value(step[0xc] + step[8],stage_range[5]);
  iVar14 = step[0xd];
  iVar19 = step[9];
  output[8] = iVar11;
  iVar12 = clamp_value(step[0xd] + step[9],stage_range[5]);
  iVar15 = step[0xe];
  iVar11 = step[10];
  output[9] = iVar12;
  iVar20 = clamp_value(step[0xe] + step[10],stage_range[5]);
  iVar16 = step[0xf];
  iVar12 = step[0xb];
  output[10] = iVar20;
  iVar20 = clamp_value(step[0xf] + step[0xb],stage_range[5]);
  output[0xb] = iVar20;
  iVar18 = clamp_value(iVar18 - iVar13,stage_range[5]);
  output[0xc] = iVar18;
  iVar18 = clamp_value(iVar19 - iVar14,stage_range[5]);
  output[0xd] = iVar18;
  iVar18 = clamp_value(iVar11 - iVar15,stage_range[5]);
  output[0xe] = iVar18;
  iVar18 = clamp_value(iVar12 - iVar16,stage_range[5]);
  output[0xf] = iVar18;
  av1_range_check_buf(5,input,output,0x10,stage_range[5]);
  step._0_8_ = *(undefined8 *)output;
  step._8_8_ = *(undefined8 *)(output + 2);
  iVar1 = *(int *)((long)vert_filter_length_chroma + lVar24 + 0x1a0);
  iVar21 = *(int *)((long)vert_filter_length_chroma + lVar24 + 0x220);
  step[4] = (int32_t)(output[4] * iVar1 + lVar23 + (long)(output[5] * iVar21) >> (cos_bit & 0x3fU));
  step[5] = (int32_t)(iVar21 * output[4] + lVar23 + (long)(output[5] * -iVar1) >> (cos_bit & 0x3fU))
  ;
  step[6] = (int32_t)(output[7] * iVar1 + lVar23 + (long)(output[6] * -iVar21) >> (cos_bit & 0x3fU))
  ;
  step[7] = (int32_t)(output[6] * iVar1 + lVar23 + (long)(output[7] * iVar21) >> (cos_bit & 0x3fU));
  step._32_8_ = *(undefined8 *)(output + 8);
  step._40_8_ = *(undefined8 *)(output + 10);
  step[0xc] = (int32_t)(output[0xc] * iVar1 + lVar23 + (long)(output[0xd] * iVar21) >>
                       (cos_bit & 0x3fU));
  step[0xd] = (int32_t)(output[0xc] * iVar21 + lVar23 + (long)(-iVar1 * output[0xd]) >>
                       (cos_bit & 0x3fU));
  step[0xe] = (int32_t)(output[0xf] * iVar1 + lVar23 + (long)(-iVar21 * output[0xe]) >>
                       (cos_bit & 0x3fU));
  step[0xf] = (int32_t)(output[0xe] * iVar1 + lVar23 + (long)(output[0xf] * iVar21) >>
                       (cos_bit & 0x3fU));
  av1_range_check_buf(6,input,step,0x10,stage_range[6]);
  iVar18 = step[0];
  iVar11 = step[2];
  iVar19 = clamp_value(step[2] + step[0],stage_range[7]);
  *output = iVar19;
  iVar19 = step[1];
  iVar12 = step[3];
  iVar13 = clamp_value(step[1] + step[3],stage_range[7]);
  output[1] = iVar13;
  iVar18 = clamp_value(iVar18 - iVar11,stage_range[7]);
  output[2] = iVar18;
  iVar19 = clamp_value(iVar19 - iVar12,stage_range[7]);
  iVar11 = step[6];
  iVar18 = step[4];
  output[3] = iVar19;
  iVar13 = clamp_value(step[6] + step[4],stage_range[7]);
  iVar12 = step[7];
  iVar19 = step[5];
  output[4] = iVar13;
  iVar13 = clamp_value(step[5] + step[7],stage_range[7]);
  output[5] = iVar13;
  iVar18 = clamp_value(iVar18 - iVar11,stage_range[7]);
  output[6] = iVar18;
  iVar18 = clamp_value(iVar19 - iVar12,stage_range[7]);
  output[7] = iVar18;
  iVar18 = step[8];
  iVar11 = step[10];
  iVar19 = clamp_value(step[10] + step[8],stage_range[7]);
  output[8] = iVar19;
  iVar19 = step[9];
  iVar12 = step[0xb];
  iVar13 = clamp_value(step[9] + step[0xb],stage_range[7]);
  output[9] = iVar13;
  iVar18 = clamp_value(iVar18 - iVar11,stage_range[7]);
  output[10] = iVar18;
  iVar19 = clamp_value(iVar19 - iVar12,stage_range[7]);
  iVar11 = step[0xe];
  iVar18 = step[0xc];
  output[0xb] = iVar19;
  iVar13 = clamp_value(step[0xe] + step[0xc],stage_range[7]);
  iVar12 = step[0xf];
  iVar19 = step[0xd];
  output[0xc] = iVar13;
  iVar13 = clamp_value(step[0xd] + step[0xf],stage_range[7]);
  output[0xd] = iVar13;
  iVar18 = clamp_value(iVar18 - iVar11,stage_range[7]);
  output[0xe] = iVar18;
  iVar18 = clamp_value(iVar19 - iVar12,stage_range[7]);
  output[0xf] = iVar18;
  av1_range_check_buf(7,input,output,0x10,stage_range[7]);
  step._0_8_ = *(undefined8 *)output;
  iVar1 = *(int *)((long)vert_filter_length_chroma + lVar24 + 0x1e0);
  lVar24 = (long)iVar1;
  lVar22 = output[2] * lVar24 + lVar23;
  iVar21 = -iVar1;
  step[2] = (int32_t)(output[3] * iVar1 + lVar22 >> (cos_bit & 0x3fU));
  step[3] = (int32_t)(output[3] * iVar21 + lVar22 >> (cos_bit & 0x3fU));
  step._16_8_ = *(undefined8 *)(output + 4);
  lVar22 = output[6] * lVar24 + lVar23;
  step[6] = (int32_t)(output[7] * iVar1 + lVar22 >> (cos_bit & 0x3fU));
  step[7] = (int32_t)(output[7] * iVar21 + lVar22 >> (cos_bit & 0x3fU));
  step._32_8_ = *(undefined8 *)(output + 8);
  lVar22 = output[10] * lVar24 + lVar23;
  step[10] = (int32_t)(output[0xb] * iVar1 + lVar22 >> (cos_bit & 0x3fU));
  step[0xb] = (int32_t)(output[0xb] * iVar21 + lVar22 >> (cos_bit & 0x3fU));
  step._48_8_ = *(undefined8 *)(output + 0xc);
  lVar23 = output[0xe] * lVar24 + lVar23;
  step[0xe] = (int32_t)(output[0xf] * iVar1 + lVar23 >> (cos_bit & 0x3fU));
  step[0xf] = (int32_t)(iVar21 * output[0xf] + lVar23 >> (cos_bit & 0x3fU));
  av1_range_check_buf(8,input,step,0x10,stage_range[8]);
  *output = step[0];
  output[1] = -step[8];
  output[2] = step[0xc];
  output[3] = -step[4];
  output[4] = step[6];
  output[5] = -step[0xe];
  output[6] = step[10];
  output[7] = -step[2];
  output[8] = step[3];
  output[9] = -step[0xb];
  output[10] = step[0xf];
  output[0xb] = -step[7];
  output[0xc] = step[5];
  output[0xd] = -step[0xd];
  output[0xe] = step[9];
  output[0xf] = -step[1];
  return;
}

Assistant:

void av1_iadst16(const int32_t *input, int32_t *output, int8_t cos_bit,
                 const int8_t *stage_range) {
  assert(output != input);
  const int32_t size = 16;
  const int32_t *cospi = cospi_arr(cos_bit);

  int32_t stage = 0;
  int32_t *bf0, *bf1;
  int32_t step[16];

  // stage 0;

  // stage 1;
  stage++;
  bf1 = output;
  bf1[0] = input[15];
  bf1[1] = input[0];
  bf1[2] = input[13];
  bf1[3] = input[2];
  bf1[4] = input[11];
  bf1[5] = input[4];
  bf1[6] = input[9];
  bf1[7] = input[6];
  bf1[8] = input[7];
  bf1[9] = input[8];
  bf1[10] = input[5];
  bf1[11] = input[10];
  bf1[12] = input[3];
  bf1[13] = input[12];
  bf1[14] = input[1];
  bf1[15] = input[14];
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 2
  stage++;
  bf0 = output;
  bf1 = step;
  bf1[0] = half_btf(cospi[2], bf0[0], cospi[62], bf0[1], cos_bit);
  bf1[1] = half_btf(cospi[62], bf0[0], -cospi[2], bf0[1], cos_bit);
  bf1[2] = half_btf(cospi[10], bf0[2], cospi[54], bf0[3], cos_bit);
  bf1[3] = half_btf(cospi[54], bf0[2], -cospi[10], bf0[3], cos_bit);
  bf1[4] = half_btf(cospi[18], bf0[4], cospi[46], bf0[5], cos_bit);
  bf1[5] = half_btf(cospi[46], bf0[4], -cospi[18], bf0[5], cos_bit);
  bf1[6] = half_btf(cospi[26], bf0[6], cospi[38], bf0[7], cos_bit);
  bf1[7] = half_btf(cospi[38], bf0[6], -cospi[26], bf0[7], cos_bit);
  bf1[8] = half_btf(cospi[34], bf0[8], cospi[30], bf0[9], cos_bit);
  bf1[9] = half_btf(cospi[30], bf0[8], -cospi[34], bf0[9], cos_bit);
  bf1[10] = half_btf(cospi[42], bf0[10], cospi[22], bf0[11], cos_bit);
  bf1[11] = half_btf(cospi[22], bf0[10], -cospi[42], bf0[11], cos_bit);
  bf1[12] = half_btf(cospi[50], bf0[12], cospi[14], bf0[13], cos_bit);
  bf1[13] = half_btf(cospi[14], bf0[12], -cospi[50], bf0[13], cos_bit);
  bf1[14] = half_btf(cospi[58], bf0[14], cospi[6], bf0[15], cos_bit);
  bf1[15] = half_btf(cospi[6], bf0[14], -cospi[58], bf0[15], cos_bit);
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 3
  stage++;
  bf0 = step;
  bf1 = output;
  bf1[0] = clamp_value(bf0[0] + bf0[8], stage_range[stage]);
  bf1[1] = clamp_value(bf0[1] + bf0[9], stage_range[stage]);
  bf1[2] = clamp_value(bf0[2] + bf0[10], stage_range[stage]);
  bf1[3] = clamp_value(bf0[3] + bf0[11], stage_range[stage]);
  bf1[4] = clamp_value(bf0[4] + bf0[12], stage_range[stage]);
  bf1[5] = clamp_value(bf0[5] + bf0[13], stage_range[stage]);
  bf1[6] = clamp_value(bf0[6] + bf0[14], stage_range[stage]);
  bf1[7] = clamp_value(bf0[7] + bf0[15], stage_range[stage]);
  bf1[8] = clamp_value(bf0[0] - bf0[8], stage_range[stage]);
  bf1[9] = clamp_value(bf0[1] - bf0[9], stage_range[stage]);
  bf1[10] = clamp_value(bf0[2] - bf0[10], stage_range[stage]);
  bf1[11] = clamp_value(bf0[3] - bf0[11], stage_range[stage]);
  bf1[12] = clamp_value(bf0[4] - bf0[12], stage_range[stage]);
  bf1[13] = clamp_value(bf0[5] - bf0[13], stage_range[stage]);
  bf1[14] = clamp_value(bf0[6] - bf0[14], stage_range[stage]);
  bf1[15] = clamp_value(bf0[7] - bf0[15], stage_range[stage]);
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 4
  stage++;
  bf0 = output;
  bf1 = step;
  bf1[0] = bf0[0];
  bf1[1] = bf0[1];
  bf1[2] = bf0[2];
  bf1[3] = bf0[3];
  bf1[4] = bf0[4];
  bf1[5] = bf0[5];
  bf1[6] = bf0[6];
  bf1[7] = bf0[7];
  bf1[8] = half_btf(cospi[8], bf0[8], cospi[56], bf0[9], cos_bit);
  bf1[9] = half_btf(cospi[56], bf0[8], -cospi[8], bf0[9], cos_bit);
  bf1[10] = half_btf(cospi[40], bf0[10], cospi[24], bf0[11], cos_bit);
  bf1[11] = half_btf(cospi[24], bf0[10], -cospi[40], bf0[11], cos_bit);
  bf1[12] = half_btf(-cospi[56], bf0[12], cospi[8], bf0[13], cos_bit);
  bf1[13] = half_btf(cospi[8], bf0[12], cospi[56], bf0[13], cos_bit);
  bf1[14] = half_btf(-cospi[24], bf0[14], cospi[40], bf0[15], cos_bit);
  bf1[15] = half_btf(cospi[40], bf0[14], cospi[24], bf0[15], cos_bit);
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 5
  stage++;
  bf0 = step;
  bf1 = output;
  bf1[0] = clamp_value(bf0[0] + bf0[4], stage_range[stage]);
  bf1[1] = clamp_value(bf0[1] + bf0[5], stage_range[stage]);
  bf1[2] = clamp_value(bf0[2] + bf0[6], stage_range[stage]);
  bf1[3] = clamp_value(bf0[3] + bf0[7], stage_range[stage]);
  bf1[4] = clamp_value(bf0[0] - bf0[4], stage_range[stage]);
  bf1[5] = clamp_value(bf0[1] - bf0[5], stage_range[stage]);
  bf1[6] = clamp_value(bf0[2] - bf0[6], stage_range[stage]);
  bf1[7] = clamp_value(bf0[3] - bf0[7], stage_range[stage]);
  bf1[8] = clamp_value(bf0[8] + bf0[12], stage_range[stage]);
  bf1[9] = clamp_value(bf0[9] + bf0[13], stage_range[stage]);
  bf1[10] = clamp_value(bf0[10] + bf0[14], stage_range[stage]);
  bf1[11] = clamp_value(bf0[11] + bf0[15], stage_range[stage]);
  bf1[12] = clamp_value(bf0[8] - bf0[12], stage_range[stage]);
  bf1[13] = clamp_value(bf0[9] - bf0[13], stage_range[stage]);
  bf1[14] = clamp_value(bf0[10] - bf0[14], stage_range[stage]);
  bf1[15] = clamp_value(bf0[11] - bf0[15], stage_range[stage]);
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 6
  stage++;
  bf0 = output;
  bf1 = step;
  bf1[0] = bf0[0];
  bf1[1] = bf0[1];
  bf1[2] = bf0[2];
  bf1[3] = bf0[3];
  bf1[4] = half_btf(cospi[16], bf0[4], cospi[48], bf0[5], cos_bit);
  bf1[5] = half_btf(cospi[48], bf0[4], -cospi[16], bf0[5], cos_bit);
  bf1[6] = half_btf(-cospi[48], bf0[6], cospi[16], bf0[7], cos_bit);
  bf1[7] = half_btf(cospi[16], bf0[6], cospi[48], bf0[7], cos_bit);
  bf1[8] = bf0[8];
  bf1[9] = bf0[9];
  bf1[10] = bf0[10];
  bf1[11] = bf0[11];
  bf1[12] = half_btf(cospi[16], bf0[12], cospi[48], bf0[13], cos_bit);
  bf1[13] = half_btf(cospi[48], bf0[12], -cospi[16], bf0[13], cos_bit);
  bf1[14] = half_btf(-cospi[48], bf0[14], cospi[16], bf0[15], cos_bit);
  bf1[15] = half_btf(cospi[16], bf0[14], cospi[48], bf0[15], cos_bit);
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 7
  stage++;
  bf0 = step;
  bf1 = output;
  bf1[0] = clamp_value(bf0[0] + bf0[2], stage_range[stage]);
  bf1[1] = clamp_value(bf0[1] + bf0[3], stage_range[stage]);
  bf1[2] = clamp_value(bf0[0] - bf0[2], stage_range[stage]);
  bf1[3] = clamp_value(bf0[1] - bf0[3], stage_range[stage]);
  bf1[4] = clamp_value(bf0[4] + bf0[6], stage_range[stage]);
  bf1[5] = clamp_value(bf0[5] + bf0[7], stage_range[stage]);
  bf1[6] = clamp_value(bf0[4] - bf0[6], stage_range[stage]);
  bf1[7] = clamp_value(bf0[5] - bf0[7], stage_range[stage]);
  bf1[8] = clamp_value(bf0[8] + bf0[10], stage_range[stage]);
  bf1[9] = clamp_value(bf0[9] + bf0[11], stage_range[stage]);
  bf1[10] = clamp_value(bf0[8] - bf0[10], stage_range[stage]);
  bf1[11] = clamp_value(bf0[9] - bf0[11], stage_range[stage]);
  bf1[12] = clamp_value(bf0[12] + bf0[14], stage_range[stage]);
  bf1[13] = clamp_value(bf0[13] + bf0[15], stage_range[stage]);
  bf1[14] = clamp_value(bf0[12] - bf0[14], stage_range[stage]);
  bf1[15] = clamp_value(bf0[13] - bf0[15], stage_range[stage]);
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 8
  stage++;
  bf0 = output;
  bf1 = step;
  bf1[0] = bf0[0];
  bf1[1] = bf0[1];
  bf1[2] = half_btf(cospi[32], bf0[2], cospi[32], bf0[3], cos_bit);
  bf1[3] = half_btf(cospi[32], bf0[2], -cospi[32], bf0[3], cos_bit);
  bf1[4] = bf0[4];
  bf1[5] = bf0[5];
  bf1[6] = half_btf(cospi[32], bf0[6], cospi[32], bf0[7], cos_bit);
  bf1[7] = half_btf(cospi[32], bf0[6], -cospi[32], bf0[7], cos_bit);
  bf1[8] = bf0[8];
  bf1[9] = bf0[9];
  bf1[10] = half_btf(cospi[32], bf0[10], cospi[32], bf0[11], cos_bit);
  bf1[11] = half_btf(cospi[32], bf0[10], -cospi[32], bf0[11], cos_bit);
  bf1[12] = bf0[12];
  bf1[13] = bf0[13];
  bf1[14] = half_btf(cospi[32], bf0[14], cospi[32], bf0[15], cos_bit);
  bf1[15] = half_btf(cospi[32], bf0[14], -cospi[32], bf0[15], cos_bit);
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 9
  bf0 = step;
  bf1 = output;
  bf1[0] = bf0[0];
  bf1[1] = -bf0[8];
  bf1[2] = bf0[12];
  bf1[3] = -bf0[4];
  bf1[4] = bf0[6];
  bf1[5] = -bf0[14];
  bf1[6] = bf0[10];
  bf1[7] = -bf0[2];
  bf1[8] = bf0[3];
  bf1[9] = -bf0[11];
  bf1[10] = bf0[15];
  bf1[11] = -bf0[7];
  bf1[12] = bf0[5];
  bf1[13] = -bf0[13];
  bf1[14] = bf0[9];
  bf1[15] = -bf0[1];
}